

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# CommandLineTestRunnerTest.cpp
# Opt level: O0

void __thiscall
TEST_CommandLineTestRunner_testsCanBeRunInReverseOrder_Test::
TEST_CommandLineTestRunner_testsCanBeRunInReverseOrder_Test
          (TEST_CommandLineTestRunner_testsCanBeRunInReverseOrder_Test *this)

{
  TEST_CommandLineTestRunner_testsCanBeRunInReverseOrder_Test *this_local;
  
  memset(this,0,0x58);
  TEST_GROUP_CppUTestGroupCommandLineTestRunner::TEST_GROUP_CppUTestGroupCommandLineTestRunner
            (&this->super_TEST_GROUP_CppUTestGroupCommandLineTestRunner);
  (this->super_TEST_GROUP_CppUTestGroupCommandLineTestRunner).super_Utest._vptr_Utest =
       (_func_int **)&PTR__TEST_CommandLineTestRunner_testsCanBeRunInReverseOrder_Test_003ce838;
  return;
}

Assistant:

TEST(CommandLineTestRunner, testsCanBeRunInReverseOrder)
{
    const char* argv[] = { "tests.exe", "-v", "-b"};

    registry.addTest(test2);
    CommandLineTestRunnerWithStringBufferOutput commandLineTestRunner(3, argv, &registry);
    commandLineTestRunner.runAllTestsMain();

    SimpleStringCollection stringCollection;
    commandLineTestRunner.fakeConsoleOutputWhichIsReallyABuffer->getOutput().split("\n", stringCollection);
    STRCMP_CONTAINS("test1", stringCollection[0].asCharString());
    STRCMP_CONTAINS("test2", stringCollection[1].asCharString());
}